

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O1

int N_VWrmsNormMaskVectorArray_Serial(int nvec,N_Vector *X,N_Vector *W,N_Vector id,realtype *nrm)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  realtype rVar7;
  double dVar8;
  double dVar9;
  
  if (0 < nvec) {
    if (nvec == 1) {
      rVar7 = N_VWrmsNormMask_Serial(*X,*W,id);
      *nrm = rVar7;
    }
    else {
      uVar1 = *(*X)->content;
      lVar2 = *(long *)((long)id->content + 8);
      uVar6 = 0;
      do {
        lVar3 = *(long *)((long)X[uVar6]->content + 8);
        lVar4 = *(long *)((long)W[uVar6]->content + 8);
        nrm[uVar6] = 0.0;
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            if (0.0 < *(double *)(lVar2 + uVar5 * 8)) {
              dVar8 = *(double *)(lVar3 + uVar5 * 8) * *(double *)(lVar4 + uVar5 * 8);
              nrm[uVar6] = dVar8 * dVar8 + nrm[uVar6];
            }
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
        dVar8 = nrm[uVar6] / (double)(int)uVar1;
        dVar9 = 0.0;
        if (0.0 < dVar8) {
          if (dVar8 < 0.0) {
            dVar9 = sqrt(dVar8);
          }
          else {
            dVar9 = SQRT(dVar8);
          }
        }
        nrm[uVar6] = dVar9;
        uVar6 = uVar6 + 1;
      } while (uVar6 != (uint)nvec);
    }
    return 0;
  }
  return -1;
}

Assistant:

int N_VWrmsNormMaskVectorArray_Serial(int nvec, N_Vector* X, N_Vector* W,
                                      N_Vector id, realtype* nrm)
{
  int          i;
  sunindextype j, N;
  realtype*    wd=NULL;
  realtype*    xd=NULL;
  realtype*    idd=NULL;

  /* invalid number of vectors */
  if (nvec < 1) return(-1);

  /* should have called N_VWrmsNorm */
  if (nvec == 1) {
    nrm[0] = N_VWrmsNormMask_Serial(X[0], W[0], id);
    return(0);
  }

  /* get vector length and mask data array */
  N   = NV_LENGTH_S(X[0]);
  idd = NV_DATA_S(id);

  /* compute the WRMS norm for each vector in the vector array */
  for (i=0; i<nvec; i++) {
    xd = NV_DATA_S(X[i]);
    wd = NV_DATA_S(W[i]);
    nrm[i] = ZERO;
    for (j=0; j<N; j++) {
      if (idd[j] > ZERO)
        nrm[i] += SUNSQR(xd[j] * wd[j]);
    }
    nrm[i] = SUNRsqrt(nrm[i]/N);
  }

  return(0);
}